

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  int iVar3;
  ImU32 IVar4;
  uint uVar5;
  GetterXsYs<long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  long lVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<long_long> *pGVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  int iVar17;
  long lVar18;
  ImDrawIdx IVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pIVar15 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar17 = pGVar6->Count;
  lVar18 = (long)(((pGVar6->Offset + prim) % iVar17 + iVar17) % iVar17) * (long)pGVar6->Stride;
  lVar8 = *(long *)((long)pGVar6->Ys + lVar18);
  dVar21 = log10((double)*(long *)((long)pGVar6->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = GImPlot;
  pIVar9 = pIVar15->CurrentPlot;
  dVar1 = (pIVar9->XAxis).Range.Min;
  iVar17 = pTVar7->YAxis;
  pGVar10 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar3 = pGVar10->Count;
  IVar2 = pIVar15->PixelRange[iVar17].Min;
  fVar24 = (float)(pIVar15->My[iVar17] * ((double)lVar8 - pIVar9->YAxis[iVar17].Range.Min) +
                  (double)IVar2.y);
  fVar25 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar21 / pIVar15->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar10->YRef;
  dVar22 = log10((double)*(long *)((long)pGVar10->Xs +
                                  (long)(((prim + pGVar10->Offset) % iVar3 + iVar3) % iVar3) *
                                  (long)pGVar10->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar16->CurrentPlot;
  dVar21 = (pIVar9->XAxis).Range.Min;
  iVar17 = pTVar7->YAxis;
  IVar2 = pIVar16->PixelRange[iVar17].Min;
  fVar20 = (float)(pIVar16->Mx *
                   (((double)(float)(dVar22 / pIVar16->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar21) + dVar21) - dVar21) + (double)IVar2.x);
  fVar23 = (float)(pIVar16->My[iVar17] * (dVar1 - pIVar9->YAxis[iVar17].Range.Min) + (double)IVar2.y
                  );
  auVar29._0_4_ = ~-(uint)(fVar20 <= fVar25) & (uint)fVar20;
  auVar29._4_4_ = ~-(uint)(fVar23 <= fVar24) & (uint)fVar23;
  auVar29._8_4_ = ~-(uint)(fVar25 < fVar20) & (uint)fVar20;
  auVar29._12_4_ = ~-(uint)(fVar24 < fVar23) & (uint)fVar23;
  auVar13._4_4_ = (uint)fVar24 & -(uint)(fVar23 <= fVar24);
  auVar13._0_4_ = (uint)fVar25 & -(uint)(fVar20 <= fVar25);
  auVar13._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar20);
  auVar13._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar23);
  auVar29 = auVar29 | auVar13;
  fVar26 = (cull_rect->Min).y;
  auVar31._4_4_ = -(uint)(fVar26 < auVar29._4_4_);
  auVar31._0_4_ = -(uint)((cull_rect->Min).x < auVar29._0_4_);
  auVar14._4_8_ = auVar29._8_8_;
  auVar14._0_4_ = -(uint)(auVar29._4_4_ < fVar26);
  auVar30._0_8_ = auVar14._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(auVar29._8_4_ < (cull_rect->Max).x);
  auVar30._12_4_ = -(uint)(auVar29._12_4_ < (cull_rect->Max).y);
  auVar31._8_8_ = auVar30._8_8_;
  iVar17 = movmskps((int)cull_rect,auVar31);
  if (iVar17 == 0xf) {
    IVar4 = this->Col;
    IVar2 = *uv;
    fVar26 = fVar20 - fVar25;
    fVar27 = fVar23 - fVar24;
    fVar28 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar26 = fVar26 * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    fVar28 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar26 = fVar28 * fVar26;
    fVar28 = fVar28 * fVar27;
    (pIVar11->pos).x = fVar28 + fVar25;
    (pIVar11->pos).y = fVar24 - fVar26;
    (pIVar11->uv).x = IVar2.x;
    (pIVar11->uv).y = IVar2.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar4;
    pIVar11[1].pos.x = fVar28 + fVar20;
    pIVar11[1].pos.y = fVar23 - fVar26;
    pIVar11[1].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar4;
    pIVar11[2].pos.x = fVar20 - fVar28;
    pIVar11[2].pos.y = fVar23 + fVar26;
    pIVar11[2].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar4;
    pIVar11[3].pos.x = fVar25 - fVar28;
    pIVar11[3].pos.y = fVar26 + fVar24;
    pIVar11[3].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar4;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar5;
    *pIVar12 = IVar19;
    pIVar12[1] = IVar19 + 1;
    pIVar12[2] = IVar19 + 2;
    pIVar12[3] = IVar19;
    pIVar12[4] = IVar19 + 2;
    pIVar12[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }